

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

size_t __thiscall
jsoncons::
basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>::size
          (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
           *this)

{
  json_storage_kind jVar1;
  array_storage *this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
  *this_01;
  basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
  *in_RDI;
  object_storage *in_stack_00000020;
  size_t local_8;
  
  jVar1 = storage_kind(in_RDI);
  this_01 = (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
             *)(ulong)(byte)(jVar1 - empty_object);
  switch(this_01) {
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
        *)0x0:
    local_8 = 0;
    break;
  default:
    local_8 = 0;
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
        *)0x4:
    basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_const_reference_storage>
              (in_RDI);
    json_const_reference_storage::value((json_const_reference_storage *)0xda850e);
    local_8 = size(this_01);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
        *)0x5:
    basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::json_reference_storage>
              (in_RDI);
    json_reference_storage::value((json_reference_storage *)0xda852f);
    local_8 = size(this_01);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
        *)0x9:
    basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
              (in_RDI);
    basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
    object_storage::value_abi_cxx11_(in_stack_00000020);
    local_8 = order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
              ::size((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
                      *)0xda84f5);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
        *)0xa:
    this_00 = basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
              ::
              cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                        (in_RDI);
    array_storage::value(this_00);
    local_8 = json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
              ::size((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
                      *)0xda84c9);
  }
  return local_8;
}

Assistant:

std::size_t size() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    return cast<array_storage>().value().size();
                case json_storage_kind::empty_object:
                    return 0;
                case json_storage_kind::object:
                    return cast<object_storage>().value().size();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().size();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().size();
                default:
                    return 0;
            }
        }